

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

int libtorrent::anon_unknown_10::line_longer_than(bdecode_node *e,int limit)

{
  int iVar1;
  ulong uVar2;
  int i;
  int iVar3;
  int iVar4;
  pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_80;
  
  if ((long)e->m_token_idx == -1) {
switchD_0018acf1_caseD_0:
    iVar4 = 4;
  }
  else {
    switch(*(uint *)(e->m_root_tokens + e->m_token_idx) >> 0x1d) {
    case 0:
      goto switchD_0018acf1_caseD_0;
    case 1:
      if (limit < 4) {
        return -1;
      }
      iVar3 = 0;
      iVar4 = 4;
      while( true ) {
        iVar1 = bdecode_node::dict_size(e);
        if (iVar1 <= iVar3) break;
        bdecode_node::dict_at(&local_80,e,iVar3);
        iVar4 = iVar4 + (int)local_80.first.len_ + 4;
        std::
        _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                         *)&local_80.second);
        if (limit < iVar4) {
          return -1;
        }
        bdecode_node::dict_at(&local_80,e,iVar3);
        iVar1 = line_longer_than(&local_80.second,limit - iVar4);
        std::
        _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                         *)&local_80.second);
        if (iVar1 == -1) {
          return -1;
        }
        iVar4 = iVar1 + iVar4 + 1;
        iVar3 = iVar3 + 1;
      }
      break;
    case 2:
      if (limit < 4) {
        return -1;
      }
      iVar4 = 4;
      for (iVar3 = 0; iVar1 = bdecode_node::list_size(e), iVar3 < iVar1; iVar3 = iVar3 + 1) {
        bdecode_node::list_at((bdecode_node *)&local_80,e,iVar3);
        iVar1 = line_longer_than((bdecode_node *)&local_80,limit - iVar4);
        std::
        _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                         *)&local_80);
        if (iVar1 == -1) {
          return -1;
        }
        iVar4 = iVar4 + iVar1 + 2;
      }
      break;
    case 3:
      iVar4 = bdecode_node::string_length(e);
      iVar4 = iVar4 + 3;
      break;
    case 4:
      uVar2 = bdecode_node::int_value(e);
      iVar4 = 2;
      for (; 0 < (long)uVar2; uVar2 = uVar2 / 10) {
        iVar4 = iVar4 + 1;
      }
      break;
    default:
      iVar4 = 0;
    }
  }
  iVar3 = -1;
  if (iVar4 <= limit) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

int line_longer_than(bdecode_node const& e, int limit)
	{
		int line_len = 0;
		switch (e.type())
		{
		case bdecode_node::list_t:
			line_len += 4;
			if (line_len > limit) return -1;
			for (int i = 0; i < e.list_size(); ++i)
			{
				int const ret = line_longer_than(e.list_at(i), limit - line_len);
				if (ret == -1) return -1;
				line_len += ret + 2;
			}
			break;
		case bdecode_node::dict_t:
			line_len += 4;
			if (line_len > limit) return -1;
			for (int i = 0; i < e.dict_size(); ++i)
			{
				line_len += 4 + int(e.dict_at(i).first.size());
				if (line_len > limit) return -1;
				int const ret = line_longer_than(e.dict_at(i).second, limit - line_len);
				if (ret == -1) return -1;
				line_len += ret + 1;
			}
			break;
		case bdecode_node::string_t:
			line_len += 3 + e.string_length();
			break;
		case bdecode_node::int_t:
		{
			std::int64_t val = e.int_value();
			while (val > 0)
			{
				++line_len;
				val /= 10;
			}
			line_len += 2;
		}
		break;
		case bdecode_node::none_t:
			line_len += 4;
			break;
		}

		if (line_len > limit) return -1;
		return line_len;
	}